

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5RowidMethod(sqlite3_vtab_cursor *pCursor,sqlite_int64 *pRowid)

{
  int iVar1;
  sqlite3_vtab *pStmt;
  int *piVar2;
  Mem *pMem;
  i64 iVar3;
  
  iVar1 = *(int *)&pCursor[4].pVtab;
  if (1 < iVar1 - 1U) {
    if (iVar1 == 3) {
      iVar3 = 0;
      goto LAB_001c4344;
    }
    if (iVar1 != 4) {
      pStmt = pCursor[7].pVtab;
      pMem = columnMem((sqlite3_stmt *)pStmt,0);
      iVar3 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure((sqlite3_stmt *)pStmt);
      goto LAB_001c4344;
    }
  }
  if (pCursor[9].pVtab == (sqlite3_vtab *)0x0) {
    piVar2 = (int *)((pCursor[8].pVtab)->zErrMsg + 0x18);
  }
  else {
    piVar2 = &(pCursor[9].pVtab)->nRef;
  }
  iVar3 = *(i64 *)piVar2;
LAB_001c4344:
  *pRowid = iVar3;
  return 0;
}

Assistant:

static int fts5RowidMethod(sqlite3_vtab_cursor *pCursor, sqlite_int64 *pRowid){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
  int ePlan = pCsr->ePlan;
  
  assert( CsrFlagTest(pCsr, FTS5CSR_EOF)==0 );
  switch( ePlan ){
    case FTS5_PLAN_SPECIAL:
      *pRowid = 0;
      break;

    case FTS5_PLAN_SOURCE:
    case FTS5_PLAN_MATCH:
    case FTS5_PLAN_SORTED_MATCH:
      *pRowid = fts5CursorRowid(pCsr);
      break;

    default:
      *pRowid = sqlite3_column_int64(pCsr->pStmt, 0);
      break;
  }

  return SQLITE_OK;
}